

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O0

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar9;
  float val_2;
  int k_1;
  float sum_3;
  float *sptr_1;
  int j_5;
  int i_7;
  float *outptr_4;
  Mat m_12;
  int q_6;
  float val_1;
  int sx;
  int kj;
  int sy;
  int ki;
  int area;
  float sum_2;
  int sx0;
  int j_4;
  int sy0;
  int i_6;
  float *outptr_3;
  Mat m_9;
  int q_5;
  int htailpad;
  int wtailpad;
  float val;
  int k;
  float max_2;
  float *sptr;
  int j_3;
  int i_5;
  float *outptr_2;
  Mat m_6;
  int q_4;
  int j_2;
  int i_4;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  int iw_1;
  int ih_1;
  float sum_1;
  int wk;
  int iw1_1;
  int iw0_1;
  int j_1;
  int hk;
  int ih1_1;
  int ih0_1;
  int i_3;
  float *outptr_1;
  float *inptr_1;
  int q_3;
  int iw;
  int ih;
  float max_1;
  int iw1;
  int iw0;
  int j;
  int ih1;
  int ih0;
  int i_2;
  float *outptr;
  float *inptr;
  int q_2;
  int i_1;
  float sum;
  float *ptr_1;
  int q_1;
  int i;
  float max;
  float *ptr;
  int q;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m_4;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_14;
  Mat *m_13;
  Mat *m_11;
  Mat *m_10;
  Mat *m_8;
  Mat *m_7;
  Mat *m_5;
  Mat *m_3;
  Allocator *in_stack_ffffffffffffee08;
  allocator_type *in_stack_ffffffffffffee10;
  size_type in_stack_ffffffffffffee18;
  Mat *in_stack_ffffffffffffee20;
  undefined8 in_stack_ffffffffffffee28;
  Mat *in_stack_ffffffffffffee30;
  bool local_10c1;
  Option *in_stack_ffffffffffffef70;
  Mat *in_stack_ffffffffffffef78;
  Mat *in_stack_ffffffffffffef80;
  Pooling *in_stack_ffffffffffffef88;
  int local_f98;
  float local_f94;
  int local_f88;
  int local_f84;
  undefined8 local_f80;
  undefined8 local_f78;
  undefined8 local_f70;
  undefined4 local_f68;
  long local_f60;
  undefined4 local_f58;
  undefined4 local_f54;
  undefined4 local_f50;
  undefined4 local_f4c;
  undefined4 local_f48;
  undefined8 local_f40;
  long local_f38;
  undefined8 local_f30;
  undefined8 local_f28;
  undefined8 local_f20;
  undefined4 local_f18;
  long *local_f10;
  undefined4 local_f08;
  undefined4 local_f04;
  undefined4 local_f00;
  undefined4 local_efc;
  undefined4 local_ef8;
  undefined8 local_ef0;
  int local_ee8;
  float local_ee4;
  int local_ee0;
  int local_edc;
  int local_ed8;
  int local_ed4;
  int local_ed0;
  float local_ecc;
  int local_ec8;
  int local_ec4;
  int local_ec0;
  int local_ebc;
  undefined8 local_eb8;
  undefined8 local_eb0;
  undefined8 local_ea8;
  undefined4 local_ea0;
  long local_e98;
  undefined4 local_e90;
  undefined4 local_e8c;
  undefined4 local_e88;
  undefined4 local_e84;
  undefined4 local_e80;
  undefined8 local_e78;
  long local_e70;
  undefined8 local_e68;
  undefined8 local_e60;
  undefined8 local_e58;
  undefined4 local_e50;
  long *local_e48;
  undefined4 local_e40;
  undefined4 local_e3c;
  undefined4 local_e38;
  undefined4 local_e34;
  undefined4 local_e30;
  undefined8 local_e28;
  int local_e20;
  int local_e1c;
  int local_e18;
  float local_e14;
  int local_e10;
  float local_e0c;
  float *local_e08;
  int local_e00;
  int local_dfc;
  undefined8 local_df8;
  undefined8 local_df0;
  undefined8 local_de8;
  undefined4 local_de0;
  long local_dd8;
  undefined4 local_dd0;
  undefined4 local_dcc;
  undefined4 local_dc8;
  undefined4 local_dc4;
  undefined4 local_dc0;
  undefined8 local_db8;
  long local_db0;
  void *local_da8;
  int *local_da0;
  ulong local_d98;
  undefined4 local_d90;
  long *local_d88;
  int local_d80;
  int local_d7c;
  int local_d78;
  undefined4 local_d74;
  undefined4 local_d70;
  ulong local_d68;
  int local_d60;
  int local_d5c;
  int local_d58;
  int local_d54;
  int local_d50;
  int local_d4c;
  reference local_d48;
  vector<int,_std::allocator<int>_> local_d38;
  int local_d20;
  int local_d1c;
  int local_d18;
  undefined4 local_d14;
  void *local_d10;
  int *local_d08;
  ulong local_d00;
  undefined4 local_cf8;
  long *local_cf0;
  int local_ce8;
  int local_ce4;
  int local_ce0;
  undefined4 local_cdc;
  int local_cd8;
  long local_cd0;
  int local_cc4;
  int local_cc0;
  float local_cbc;
  int local_cac;
  int local_c9c;
  long local_c50;
  int local_bf8;
  int local_bf4;
  int local_bf0;
  float local_bec;
  int local_be8;
  int local_be4;
  int local_be0;
  int local_bdc;
  int local_bd8;
  int local_bd4;
  undefined8 local_bd0;
  undefined8 local_bc8;
  undefined8 local_bc0;
  undefined4 local_bb8;
  long local_bb0;
  undefined4 local_ba8;
  undefined4 local_ba4;
  undefined4 local_ba0;
  undefined4 local_b9c;
  undefined4 local_b98;
  undefined8 local_b90;
  long local_b88;
  undefined8 local_b80;
  undefined8 local_b78;
  undefined8 local_b70;
  undefined4 local_b68;
  long local_b60;
  undefined4 local_b58;
  undefined4 local_b54;
  undefined4 local_b50;
  undefined4 local_b4c;
  undefined4 local_b48;
  undefined8 local_b40;
  long local_b38;
  int local_b2c;
  int local_b28;
  float local_b24;
  int local_ad0;
  int local_acc;
  float local_ac8 [4];
  undefined8 local_ab8;
  undefined8 local_ab0;
  undefined8 local_aa8;
  undefined4 local_aa0;
  long local_a98;
  undefined4 local_a90;
  undefined4 local_a8c;
  undefined4 local_a88;
  undefined4 local_a84;
  undefined4 local_a80;
  undefined8 local_a78;
  float *local_a70;
  int local_a68;
  int local_a64;
  long local_a60;
  int local_a54;
  int local_a50;
  int local_a4c;
  long *local_a40;
  long *local_a38;
  int local_a24;
  long *local_a20;
  void **local_a18;
  long *local_a10;
  long *local_a08;
  undefined1 local_9e5;
  int local_9e4;
  undefined8 *local_9d8;
  undefined1 local_9b5;
  int local_9b4;
  undefined8 *local_9a8;
  undefined8 *local_998;
  undefined8 *local_988;
  undefined8 *local_960;
  undefined8 *local_940;
  undefined8 *local_930;
  undefined8 *local_900;
  void **local_8f0;
  undefined8 *local_8e0;
  undefined8 *local_8d0;
  undefined8 *local_8c0;
  undefined8 *local_8b0;
  void **local_8a0;
  long local_880;
  undefined1 local_86d;
  int local_86c;
  undefined8 *local_860;
  undefined1 local_84d;
  int local_84c;
  void **local_848;
  undefined8 *local_840;
  undefined1 local_82d;
  int local_82c;
  undefined8 *local_820;
  undefined1 local_80d;
  int local_80c;
  void **local_808;
  undefined8 *local_800;
  undefined1 local_7ed;
  int local_7ec;
  undefined8 *local_7e0;
  undefined1 local_7cd;
  int local_7cc;
  void **local_7c8;
  void **local_7c0;
  undefined1 local_78d;
  int local_78c;
  undefined8 *local_780;
  undefined8 *local_770;
  undefined8 *local_768;
  undefined8 *local_760;
  undefined8 *local_750;
  void **local_748;
  int local_73c;
  undefined8 *local_738;
  int local_72c;
  undefined8 *local_728;
  int local_71c;
  void **local_718;
  long *local_710;
  long *local_708;
  void **local_700;
  long *local_6f8;
  long local_6f0;
  undefined4 local_6e4;
  long local_6e0;
  long local_6d8;
  undefined4 local_6cc;
  int local_6c8;
  int local_6c4;
  undefined8 *local_6c0;
  long *local_680;
  undefined4 local_674;
  ulong local_670;
  void *local_668;
  undefined4 local_65c;
  void **local_650;
  long local_648;
  undefined4 local_63c;
  long local_638;
  long local_630;
  undefined4 local_624;
  int local_620;
  int local_61c;
  undefined8 *local_618;
  long *local_610;
  undefined4 local_604;
  ulong local_600;
  void *local_5f8;
  undefined4 local_5ec;
  undefined8 *local_5e0;
  long local_5d8;
  undefined4 local_5cc;
  long local_5c8;
  long local_5c0;
  undefined4 local_5b4;
  int local_5b0;
  int local_5ac;
  undefined8 *local_5a8;
  long *local_5a0;
  undefined4 local_594;
  ulong local_590;
  void *local_588;
  undefined4 local_57c;
  undefined8 *local_570;
  long local_568;
  undefined4 local_55c;
  long local_558;
  long local_550;
  undefined4 local_544;
  int local_540;
  int local_53c;
  undefined8 *local_538;
  long local_530;
  undefined4 local_524;
  long local_520;
  float *local_518;
  undefined4 local_50c;
  int local_508;
  int local_504;
  undefined8 *local_500;
  long local_4c0;
  undefined4 local_4b4;
  long local_4b0;
  long local_4a8;
  undefined4 local_49c;
  int local_498;
  int local_494;
  undefined8 *local_490;
  undefined4 local_43c;
  long local_438;
  undefined4 local_41c;
  long local_418;
  undefined4 local_40c;
  long local_408;
  undefined4 local_3fc;
  long local_3f8;
  undefined4 local_3ec;
  long local_3e8;
  undefined4 local_3dc;
  long local_3d8;
  undefined4 local_3cc;
  long local_3c8;
  undefined4 local_3bc;
  long local_3b8;
  undefined4 local_39c;
  long local_398;
  int local_300;
  undefined4 local_2fc;
  void **local_2f8;
  undefined8 *local_2d8;
  undefined8 *local_2b8;
  undefined8 *local_298;
  undefined8 *local_278;
  int local_260;
  undefined4 local_25c;
  void **local_258;
  undefined8 *local_238;
  undefined8 *local_1d8;
  undefined8 *local_1b8;
  undefined8 *local_178;
  void *local_a0;
  void *local_50;
  
  local_a4c = *(int *)((long)in_RSI + 0x2c);
  local_a50 = (int)in_RSI[6];
  local_a54 = (int)in_RSI[7];
  local_a60 = in_RSI[2];
  local_a40 = in_RDX;
  local_a38 = in_RSI;
  if (*(int *)(in_RDI + 0xf4) == 0) {
    if (*(int *)(in_RDI + 0x100) == 0) {
      local_748 = &local_d10;
      local_d10 = (void *)0x0;
      local_d08 = (int *)0x0;
      local_d00 = 0;
      local_cf8 = 0;
      local_cf0 = (long *)0x0;
      local_ce8 = 0;
      local_ce4 = 0;
      local_ce0 = 0;
      local_cdc = 0;
      local_cd8 = 0;
      local_cd0 = 0;
      make_padding(in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,in_stack_ffffffffffffef78,
                   in_stack_ffffffffffffef70);
      local_a18 = &local_d10;
      if (local_d10 != (void *)0x0) {
        local_700 = local_a18;
      }
      local_10c1 = local_d10 != (void *)0x0 && local_cd0 * local_cd8 != 0;
      if (local_10c1) {
        local_a4c = local_ce4;
        local_a50 = local_ce0;
        local_d18 = (local_ce4 - *(int *)(in_RDI + 0xd4)) / *(int *)(in_RDI + 0xdc) + 1;
        local_d1c = (local_ce0 - *(int *)(in_RDI + 0xd8)) / *(int *)(in_RDI + 0xe0) + 1;
        Mat::create(in_stack_ffffffffffffee30,(int)((ulong)in_stack_ffffffffffffee28 >> 0x20),
                    (int)in_stack_ffffffffffffee28,(int)((ulong)in_stack_ffffffffffffee20 >> 0x20),
                    in_stack_ffffffffffffee18,(Allocator *)in_stack_ffffffffffffee10);
        local_a20 = local_a40;
        bVar9 = true;
        if (*local_a40 != 0) {
          local_6f8 = local_a40;
          bVar9 = local_a40[8] * (long)(int)local_a40[7] == 0;
        }
        if (bVar9) {
          local_a24 = -100;
          local_d14 = 1;
        }
        else {
          local_d20 = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
          std::allocator<int>::allocator((allocator<int> *)0xd199eb);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffee20,
                     in_stack_ffffffffffffee18,in_stack_ffffffffffffee10);
          std::allocator<int>::~allocator((allocator<int> *)0xd19a17);
          local_d48 = std::vector<int,_std::allocator<int>_>::operator[](&local_d38,0);
          local_d4c = 0;
          local_d50 = 0;
          local_d54 = local_a4c - *(int *)(in_RDI + 0xd4);
          for (local_d58 = 0; local_d58 < *(int *)(in_RDI + 0xd8); local_d58 = local_d58 + 1) {
            for (local_d5c = 0; local_d5c < *(int *)(in_RDI + 0xd4); local_d5c = local_d5c + 1) {
              local_d48[local_d4c] = local_d50;
              local_d4c = local_d4c + 1;
              local_d50 = local_d50 + 1;
            }
            local_d50 = local_d54 + local_d50;
          }
          if (*(int *)(in_RDI + 0xd0) == 0) {
            for (local_d60 = 0; local_d60 < local_a54; local_d60 = local_d60 + 1) {
              local_7c0 = &local_da8;
              local_7c8 = &local_d10;
              local_668 = (void *)((long)local_d10 + local_cd0 * local_d60 * local_d00);
              local_650 = &local_da8;
              local_3b8 = (long)local_ce4 * (long)local_ce0 * local_d00;
              local_d68 = (local_3b8 + 0xfU & 0xfffffffffffffff0) / local_d00;
              local_d80 = local_ce8 + -1;
              if (local_ce8 == 4) {
                local_d68 = (long)local_ce4 * (long)local_ce0;
              }
              local_7e0 = &local_df8;
              local_61c = *(int *)((long)local_a40 + 0x2c);
              local_620 = (int)local_a40[6];
              local_624 = *(undefined4 *)((long)local_a40 + 0x34);
              local_db0 = *local_a40 + local_a40[8] * (long)local_d60 * local_a40[2];
              local_638 = local_a40[2];
              local_63c = (undefined4)local_a40[3];
              local_648 = local_a40[4];
              local_618 = &local_df8;
              local_3c8 = (long)local_61c * (long)local_620 * local_638;
              local_760 = &local_df8;
              local_900 = &local_df8;
              local_d70 = local_cdc;
              local_d74 = 1;
              local_d78 = local_ce0;
              local_d7c = local_ce4;
              local_d88 = local_cf0;
              local_d90 = local_cf8;
              local_d98 = local_d00;
              local_da0 = (int *)0x0;
              local_3bc = 0x10;
              local_3cc = 0x10;
              local_65c = local_cdc;
              local_670 = local_d00;
              local_674 = local_cf8;
              local_680 = local_cf0;
              local_7cc = local_d60;
              local_7cd = 1;
              local_7ec = local_d60;
              local_7ed = 1;
              local_df8 = 0;
              local_de8 = 0;
              local_de0 = 0;
              local_dd0 = 0;
              local_dcc = 0;
              local_dc8 = 0;
              local_dc4 = 0;
              local_dc0 = 0;
              local_db8 = 0;
              local_df0 = 0;
              local_630 = local_db0;
              local_238 = local_900;
              local_dd8 = local_648;
              local_da8 = local_668;
              for (local_dfc = 0; local_dfc < local_d1c; local_dfc = local_dfc + 1) {
                for (local_e00 = 0; local_e00 < local_d18; local_e00 = local_e00 + 1) {
                  local_71c = local_dfc * *(int *)(in_RDI + 0xe0);
                  local_718 = &local_da8;
                  local_e08 = (float *)((long)local_da8 +
                                       (long)(local_e00 * *(int *)(in_RDI + 0xdc)) * 4 +
                                       (long)local_d7c * (long)local_71c * local_d98);
                  local_e0c = *local_e08;
                  for (local_e10 = 0; local_e10 < local_d20; local_e10 = local_e10 + 1) {
                    local_e14 = local_e08[local_d48[local_e10]];
                    pfVar8 = std::max<float>(&local_e0c,&local_e14);
                    local_e0c = *pfVar8;
                  }
                  *(float *)(local_db0 + (long)local_e00 * 4) = local_e0c;
                }
                local_db0 = local_db0 + (long)local_d18 * 4;
              }
              local_8f0 = &local_da8;
              local_258 = local_8f0;
              if (local_da0 != (int *)0x0) {
                local_25c = 0xffffffff;
                LOCK();
                local_260 = *local_da0;
                *local_da0 = *local_da0 + -1;
                UNLOCK();
                if (local_260 == 1) {
                  if (local_d88 == (long *)0x0) {
                    local_a0 = local_da8;
                    if (local_da8 != (void *)0x0) {
                      free(local_da8);
                    }
                  }
                  else {
                    (**(code **)(*local_d88 + 0x18))(local_d88,local_da8);
                  }
                }
              }
              local_da8 = (void *)0x0;
              local_d98 = 0;
              local_d90 = 0;
              local_d80 = 0;
              local_d7c = 0;
              local_d78 = 0;
              local_d74 = 0;
              local_d70 = 0;
              local_d68 = 0;
              local_da0 = (int *)0x0;
            }
          }
          else if (*(int *)(in_RDI + 0xd0) == 1) {
            if (*(int *)(in_RDI + 0xfc) == 0) {
              local_e18 = 0;
              local_e1c = 0;
              if (*(int *)(in_RDI + 0xf8) == 0) {
                local_e18 = ((local_ce4 - *(int *)((long)local_a38 + 0x2c)) -
                            *(int *)(in_RDI + 0xe4)) - *(int *)(in_RDI + 0xe8);
                local_e1c = ((local_ce0 - (int)local_a38[6]) - *(int *)(in_RDI + 0xec)) -
                            *(int *)(in_RDI + 0xf0);
              }
              for (local_e20 = 0; local_e20 < local_a54; local_e20 = local_e20 + 1) {
                local_800 = &local_e68;
                local_808 = &local_d10;
                local_5f8 = (void *)((long)local_d10 + local_cd0 * local_e20 * local_d00);
                local_5e0 = &local_e68;
                local_3d8 = (long)local_ce4 * (long)local_ce0 * local_d00;
                local_820 = &local_eb8;
                local_5ac = *(int *)((long)local_a40 + 0x2c);
                local_5b0 = (int)local_a40[6];
                local_5b4 = *(undefined4 *)((long)local_a40 + 0x34);
                local_5c0 = *local_a40 + local_a40[8] * (long)local_e20 * local_a40[2];
                local_5c8 = local_a40[2];
                local_5cc = (undefined4)local_a40[3];
                local_5d8 = local_a40[4];
                local_5a8 = &local_eb8;
                local_3e8 = (long)local_5ac * (long)local_5b0 * local_5c8;
                local_768 = &local_eb8;
                local_8e0 = &local_eb8;
                local_e48 = local_cf0;
                local_3dc = 0x10;
                local_3ec = 0x10;
                local_5ec = local_cdc;
                local_600 = local_d00;
                local_604 = local_cf8;
                local_610 = local_cf0;
                local_80c = local_e20;
                local_80d = 1;
                local_82c = local_e20;
                local_82d = 1;
                local_eb8 = 0;
                local_ea8 = 0;
                local_ea0 = 0;
                local_e90 = 0;
                local_e8c = 0;
                local_e88 = 0;
                local_e84 = 0;
                local_e80 = 0;
                local_e78 = 0;
                local_eb0 = 0;
                local_e70 = local_5c0;
                for (local_ebc = 0; local_ebc < local_d1c; local_ebc = local_ebc + 1) {
                  local_ec0 = local_ebc * *(int *)(in_RDI + 0xe0);
                  for (local_ec4 = 0; local_ec4 < local_d18; local_ec4 = local_ec4 + 1) {
                    local_ec8 = local_ec4 * *(int *)(in_RDI + 0xdc);
                    local_ecc = 0.0;
                    local_ed0 = 0;
                    for (local_ed4 = 0; local_ed4 < *(int *)(in_RDI + 0xd8);
                        local_ed4 = local_ed4 + 1) {
                      local_ed8 = local_ec0 + local_ed4;
                      if (*(int *)(in_RDI + 0xec) <= local_ed8) {
                        if ((local_a50 - *(int *)(in_RDI + 0xf0)) - local_e1c <= local_ed8) break;
                        for (local_edc = 0; local_edc < *(int *)(in_RDI + 0xd4);
                            local_edc = local_edc + 1) {
                          local_ee0 = local_ec8 + local_edc;
                          if (*(int *)(in_RDI + 0xe4) <= local_ee0) {
                            if ((local_a4c - *(int *)(in_RDI + 0xe8)) - local_e18 <= local_ee0)
                            break;
                            local_728 = &local_e68;
                            local_ee4 = *(float *)((long)local_5f8 +
                                                  (long)local_ee0 * 4 +
                                                  (long)local_ce4 * (long)local_ed8 * local_d00);
                            local_ecc = local_ee4 + local_ecc;
                            local_ed0 = local_ed0 + 1;
                            local_72c = local_ed8;
                          }
                        }
                      }
                    }
                    *(float *)(local_e70 + (long)local_ec4 * 4) = local_ecc / (float)local_ed0;
                  }
                  local_e70 = local_e70 + (long)local_d18 * 4;
                }
                local_8d0 = &local_e68;
                local_e68 = 0;
                local_e58 = 0;
                local_e50 = 0;
                local_e40 = 0;
                local_e3c = 0;
                local_e38 = 0;
                local_e34 = 0;
                local_e30 = 0;
                local_e28 = 0;
                local_e60 = 0;
                local_298 = local_8d0;
                local_278 = local_8e0;
                local_e98 = local_5d8;
              }
            }
            else {
              for (local_ee8 = 0; local_ee8 < local_a54; local_ee8 = local_ee8 + 1) {
                local_840 = &local_f30;
                local_848 = &local_d10;
                local_588 = (void *)((long)local_d10 + local_cd0 * local_ee8 * local_d00);
                local_570 = &local_f30;
                local_3f8 = (long)local_ce4 * (long)local_ce0 * local_d00;
                local_860 = &local_f80;
                local_53c = *(int *)((long)local_a40 + 0x2c);
                local_540 = (int)local_a40[6];
                local_544 = *(undefined4 *)((long)local_a40 + 0x34);
                local_550 = *local_a40 + local_a40[8] * (long)local_ee8 * local_a40[2];
                local_558 = local_a40[2];
                local_55c = (undefined4)local_a40[3];
                local_568 = local_a40[4];
                local_538 = &local_f80;
                local_408 = (long)local_53c * (long)local_540 * local_558;
                local_770 = &local_f80;
                local_8c0 = &local_f80;
                local_f80 = 0;
                local_f70 = 0;
                local_f68 = 0;
                local_f58 = 0;
                local_f54 = 0;
                local_f50 = 0;
                local_f4c = 0;
                local_f48 = 0;
                local_f40 = 0;
                local_f78 = 0;
                local_f38 = local_550;
                for (local_f84 = 0; local_f84 < local_d1c; local_f84 = local_f84 + 1) {
                  for (local_f88 = 0; local_f88 < local_d18; local_f88 = local_f88 + 1) {
                    local_73c = local_f84 * *(int *)(in_RDI + 0xe0);
                    local_738 = &local_f30;
                    in_stack_ffffffffffffee10 =
                         (allocator_type *)
                         ((long)local_588 + (long)local_ce4 * (long)local_73c * local_d00);
                    local_f94 = 0.0;
                    for (local_f98 = 0; local_f98 < local_d20; local_f98 = local_f98 + 1) {
                      local_f94 = *(float *)(in_stack_ffffffffffffee10 +
                                            (long)local_d48[local_f98] * 4 +
                                            (long)(local_f88 * *(int *)(in_RDI + 0xdc)) * 4) +
                                  local_f94;
                    }
                    *(float *)(local_f38 + (long)local_f88 * 4) = local_f94 / (float)local_d20;
                  }
                  local_f38 = local_f38 + (long)local_d18 * 4;
                }
                local_8b0 = &local_f30;
                local_f10 = local_cf0;
                local_3fc = 0x10;
                local_40c = 0x10;
                local_57c = local_cdc;
                local_590 = local_d00;
                local_594 = local_cf8;
                local_5a0 = local_cf0;
                local_84c = local_ee8;
                local_84d = 1;
                local_86c = local_ee8;
                local_86d = 1;
                local_f30 = 0;
                local_f20 = 0;
                local_f18 = 0;
                local_f08 = 0;
                local_f04 = 0;
                local_f00 = 0;
                local_efc = 0;
                local_ef8 = 0;
                local_ef0 = 0;
                local_f28 = 0;
                local_2d8 = local_8b0;
                local_2b8 = local_8c0;
                local_f60 = local_568;
              }
            }
          }
          local_a24 = 0;
          local_d14 = 1;
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffee10);
        }
      }
      else {
        local_a24 = -100;
        local_d14 = 1;
      }
      local_8a0 = &local_d10;
      if (local_d08 != (int *)0x0) {
        local_2fc = 0xffffffff;
        LOCK();
        local_300 = *local_d08;
        *local_d08 = *local_d08 + -1;
        UNLOCK();
        if (local_300 == 1) {
          local_2f8 = local_8a0;
          if (local_cf0 == (long *)0x0) {
            local_50 = local_d10;
            if (local_d10 != (void *)0x0) {
              free(local_d10);
            }
          }
          else {
            (**(code **)(*local_cf0 + 0x18))(local_cf0,local_d10);
          }
        }
      }
    }
    else {
      Mat::create(in_stack_ffffffffffffee30,(int)((ulong)in_stack_ffffffffffffee28 >> 0x20),
                  (int)in_stack_ffffffffffffee28,(int)((ulong)in_stack_ffffffffffffee20 >> 0x20),
                  in_stack_ffffffffffffee18,(Allocator *)in_stack_ffffffffffffee10);
      local_a10 = local_a40;
      bVar9 = true;
      if (*local_a40 != 0) {
        local_708 = local_a40;
        bVar9 = local_a40[8] * (long)(int)local_a40[7] == 0;
      }
      if (bVar9) {
        local_a24 = -100;
      }
      else {
        if (*(int *)(in_RDI + 0xd0) == 0) {
          for (local_b2c = 0; local_b2c < local_a54; local_b2c = local_b2c + 1) {
            local_9d8 = &local_b80;
            local_494 = *(int *)((long)local_a38 + 0x2c);
            local_498 = (int)local_a38[6];
            local_49c = *(undefined4 *)((long)local_a38 + 0x34);
            local_b38 = *local_a38 + local_a38[8] * (long)local_b2c * local_a38[2];
            local_4b0 = local_a38[2];
            local_4b4 = (undefined4)local_a38[3];
            local_4c0 = local_a38[4];
            local_490 = &local_b80;
            local_438 = (long)local_494 * (long)local_498 * local_4b0;
            local_998 = &local_b80;
            local_940 = &local_b80;
            local_780 = &local_bd0;
            local_6c4 = *(int *)((long)local_a40 + 0x2c);
            local_6c8 = (int)local_a40[6];
            local_6cc = *(undefined4 *)((long)local_a40 + 0x34);
            local_b88 = *local_a40 + local_a40[8] * (long)local_b2c * local_a40[2];
            local_6e0 = local_a40[2];
            local_6e4 = (undefined4)local_a40[3];
            local_6f0 = local_a40[4];
            local_6c0 = &local_bd0;
            local_398 = (long)local_6c4 * (long)local_6c8 * local_6e0;
            local_750 = &local_bd0;
            local_930 = &local_bd0;
            local_b48 = 0;
            local_b4c = 0;
            local_b50 = 0;
            local_b54 = 0;
            local_b68 = 0;
            local_b70 = 0;
            local_b78 = 0;
            local_b80 = 0;
            local_39c = 0x10;
            local_43c = 0x10;
            local_78c = local_b2c;
            local_78d = 1;
            local_9e4 = local_b2c;
            local_9e5 = 1;
            local_b40 = 0;
            local_b58 = 0;
            local_bd0 = 0;
            local_bc0 = 0;
            local_bb8 = 0;
            local_ba8 = 0;
            local_ba4 = 0;
            local_ba0 = 0;
            local_b9c = 0;
            local_b98 = 0;
            local_b90 = 0;
            local_bc8 = 0;
            local_6d8 = local_b88;
            local_4a8 = local_b38;
            local_1d8 = local_930;
            local_1b8 = local_940;
            local_bb0 = local_6f0;
            local_b60 = local_4c0;
            for (local_bd4 = 0; local_bd4 < *(int *)(in_RDI + 0x108); local_bd4 = local_bd4 + 1) {
              local_bd8 = (local_a50 * local_bd4) / *(int *)(in_RDI + 0x108);
              local_bdc = (local_a50 * (local_bd4 + 1) + *(int *)(in_RDI + 0x108) + -1) /
                          *(int *)(in_RDI + 0x108);
              for (local_be0 = 0; local_be0 < *(int *)(in_RDI + 0x104); local_be0 = local_be0 + 1) {
                local_be4 = (local_a4c * local_be0) / *(int *)(in_RDI + 0x104);
                local_be8 = (local_a4c * (local_be0 + 1) + *(int *)(in_RDI + 0x104) + -1) /
                            *(int *)(in_RDI + 0x104);
                local_bec = *(float *)(local_b38 + (long)(local_bd8 * local_a4c + local_be4) * 4);
                for (local_bf0 = local_bd8; local_bf0 < local_bdc; local_bf0 = local_bf0 + 1) {
                  for (local_bf4 = local_be4; local_bf4 < local_be8; local_bf4 = local_bf4 + 1) {
                    pfVar8 = std::max<float>(&local_bec,
                                             (float *)(local_b38 +
                                                      (long)(local_bf0 * local_a4c + local_bf4) * 4)
                                            );
                    local_bec = *pfVar8;
                  }
                }
                *(float *)(local_b88 + (long)local_be0 * 4) = local_bec;
              }
              local_b88 = local_b88 + (long)*(int *)(in_RDI + 0x104) * 4;
            }
          }
        }
        else if (*(int *)(in_RDI + 0xd0) == 1) {
          for (local_bf8 = 0; local_bf8 < local_a54; local_bf8 = local_bf8 + 1) {
            lVar1 = *local_a38;
            lVar2 = local_a38[8];
            lVar3 = local_a38[2];
            local_c50 = *local_a40 + local_a40[8] * (long)local_bf8 * local_a40[2];
            for (local_c9c = 0; local_c9c < *(int *)(in_RDI + 0x108); local_c9c = local_c9c + 1) {
              iVar4 = (local_a50 * local_c9c) / *(int *)(in_RDI + 0x108);
              iVar5 = (local_a50 * (local_c9c + 1) + *(int *)(in_RDI + 0x108) + -1) /
                      *(int *)(in_RDI + 0x108);
              for (local_cac = 0; local_cac < *(int *)(in_RDI + 0x104); local_cac = local_cac + 1) {
                iVar6 = (local_a4c * local_cac) / *(int *)(in_RDI + 0x104);
                iVar7 = (local_a4c * (local_cac + 1) + *(int *)(in_RDI + 0x104) + -1) /
                        *(int *)(in_RDI + 0x104);
                local_cbc = 0.0;
                for (local_cc0 = iVar4; local_cc4 = iVar6, local_cc0 < iVar5;
                    local_cc0 = local_cc0 + 1) {
                  for (; local_cc4 < iVar7; local_cc4 = local_cc4 + 1) {
                    local_cbc = *(float *)(lVar1 + lVar2 * local_bf8 * lVar3 +
                                          (long)(local_cc0 * local_a4c + local_cc4) * 4) + local_cbc
                    ;
                  }
                }
                *(float *)(local_c50 + (long)local_cac * 4) =
                     (local_cbc / (float)(iVar5 - iVar4)) / (float)(iVar7 - iVar6);
              }
              local_c50 = local_c50 + (long)*(int *)(in_RDI + 0x104) * 4;
            }
          }
        }
        local_a24 = 0;
      }
    }
  }
  else {
    Mat::create(in_stack_ffffffffffffee20,(int)(in_stack_ffffffffffffee18 >> 0x20),
                (size_t)in_stack_ffffffffffffee10,in_stack_ffffffffffffee08);
    local_a08 = local_a40;
    bVar9 = true;
    if (*local_a40 != 0) {
      local_710 = local_a40;
      bVar9 = local_a40[8] * (long)(int)local_a40[7] == 0;
    }
    if (bVar9) {
      local_a24 = -100;
    }
    else {
      local_a64 = local_a4c * local_a50;
      if (*(int *)(in_RDI + 0xd0) == 0) {
        for (local_a68 = 0; local_a68 < local_a54; local_a68 = local_a68 + 1) {
          local_9a8 = &local_ab8;
          local_504 = *(int *)((long)local_a38 + 0x2c);
          local_508 = (int)local_a38[6];
          local_50c = *(undefined4 *)((long)local_a38 + 0x34);
          local_a70 = (float *)(*local_a38 + local_a38[8] * (long)local_a68 * local_a38[2]);
          local_520 = local_a38[2];
          local_524 = (undefined4)local_a38[3];
          local_530 = local_a38[4];
          local_500 = &local_ab8;
          local_418 = (long)local_504 * (long)local_508 * local_520;
          local_988 = &local_ab8;
          local_960 = &local_ab8;
          local_41c = 0x10;
          local_9b4 = local_a68;
          local_9b5 = 1;
          local_ab8 = 0;
          local_aa8 = 0;
          local_aa0 = 0;
          local_a90 = 0;
          local_a8c = 0;
          local_a88 = 0;
          local_a84 = 0;
          local_a80 = 0;
          local_a78 = 0;
          local_ab0 = 0;
          local_ac8[0] = *local_a70;
          local_518 = local_a70;
          local_178 = local_960;
          local_a98 = local_530;
          for (local_acc = 0; local_acc < local_a64; local_acc = local_acc + 1) {
            pfVar8 = std::max<float>(local_ac8,local_a70 + local_acc);
            local_ac8[0] = *pfVar8;
          }
          local_880 = (long)local_a68;
          *(float *)(*local_a40 + local_880 * 4) = local_ac8[0];
        }
      }
      else if (*(int *)(in_RDI + 0xd0) == 1) {
        for (local_ad0 = 0; local_ad0 < local_a54; local_ad0 = local_ad0 + 1) {
          local_b24 = 0.0;
          for (local_b28 = 0; local_b28 < local_a64; local_b28 = local_b28 + 1) {
            local_b24 = *(float *)(*local_a38 + local_a38[8] * (long)local_ad0 * local_a38[2] +
                                  (long)local_b28 * 4) + local_b24;
          }
          *(float *)(*local_a40 + (long)local_ad0 * 4) = local_b24 / (float)local_a64;
        }
      }
      local_a24 = 0;
    }
  }
  return local_a24;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, out_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                    for (int j = 0; j < out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                        float max = inptr[ih0 * w + iw0];
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                max = std::max(max, inptr[ih * w + iw]);
                            }
                        }

                        outptr[j] = max;
                    }
                    outptr += out_w;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                    const int hk = ih1 - ih0;
                    for (int j = 0; j < out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                        const int wk = iw1 - iw0;

                        float sum = 0;
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                sum += inptr[ih * w + iw];
                            }
                        }

                        outptr[j] = sum / hk / wk;
                    }

                    outptr += out_w;
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    int sy0 = i * stride_h;

                    for (int j = 0; j < outw; j++)
                    {
                        int sx0 = j * stride_w;

                        float sum = 0;
                        int area = 0;

                        for (int ki = 0; ki < kernel_h; ki++)
                        {
                            int sy = sy0 + ki;

                            if (sy < pad_top)
                                continue;

                            if (sy >= h - pad_bottom - htailpad)
                                break;

                            for (int kj = 0; kj < kernel_w; kj++)
                            {
                                int sx = sx0 + kj;

                                if (sx < pad_left)
                                    continue;

                                if (sx >= w - pad_right - wtailpad)
                                    break;

                                float val = m.row(sy)[sx];
                                sum += val;
                                area += 1;
                            }
                        }

                        outptr[j] = sum / area;
                    }

                    outptr += outw;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}